

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

long __thiscall docopt::value::asLong(value *this)

{
  long lVar1;
  runtime_error *this_00;
  value *in_RDI;
  long ret;
  size_t pos;
  string *str;
  size_t *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  long local_20;
  undefined8 in_stack_ffffffffffffffe8;
  long local_8;
  
  if (in_RDI->kind == String) {
    local_8 = std::__cxx11::stol(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
    lVar1 = std::__cxx11::string::length();
    if (local_20 != lVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffb8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    throwIfNotKind(in_RDI,(Kind)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    local_8 = (in_RDI->variant).longValue;
  }
  return local_8;
}

Assistant:

inline
	long value::asLong() const
	{
		// Attempt to convert a string to a long
		if (kind == Kind::String) {
			const std::string& str = variant.strValue;
			std::size_t pos;
			const long ret = stol(str, &pos); // Throws if it can't convert
			if (pos != str.length()) {
				// The string ended in non-digits.
				throw std::runtime_error( str + " contains non-numeric characters.");
			}
			return ret;
		}
		throwIfNotKind(Kind::Long);
		return variant.longValue;
	}